

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int prune_ext_part_none_skippable
              (PICK_MODE_CONTEXT *part_none,int must_find_valid_partition,
              int skip_non_sq_part_based_on_none,BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_local;
  int skip_non_sq_part_based_on_none_local;
  int must_find_valid_partition_local;
  PICK_MODE_CONTEXT *part_none_local;
  int local_4;
  
  if ((((skip_non_sq_part_based_on_none < 1) || (part_none == (PICK_MODE_CONTEXT *)0x0)) ||
      (part_none->skippable == 0)) || ((must_find_valid_partition != 0 || (bsize < BLOCK_16X16)))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int prune_ext_part_none_skippable(
    PICK_MODE_CONTEXT *part_none, int must_find_valid_partition,
    int skip_non_sq_part_based_on_none, BLOCK_SIZE bsize) {
  if ((skip_non_sq_part_based_on_none >= 1) && (part_none != NULL)) {
    if (part_none->skippable && !must_find_valid_partition &&
        bsize >= BLOCK_16X16) {
      return 1;
    }
  }
  return 0;
}